

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O1

void Qentem::Memory::
     Sort<true,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>,unsigned_int>
               (HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *arr,uint start,uint end)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *item2;
  uint uVar6;
  ulong uVar7;
  
  do {
    if (start == end) {
      return;
    }
    item2 = arr + start;
    uVar6 = start;
    if (start + 1 < end) {
      uVar4 = (ulong)(start + 1);
      uVar7 = (ulong)start;
      do {
        uVar6 = arr[uVar4].Key.length_;
        uVar3 = (item2->Key).length_;
        if (uVar6 < uVar3) {
          uVar3 = uVar6;
        }
        if (uVar3 != 0) {
          uVar5 = 0;
          do {
            cVar1 = (item2->Key).storage_[uVar5];
            cVar2 = arr[uVar4].Key.storage_[uVar5];
            if (cVar1 < cVar2) break;
            if (cVar2 < cVar1) {
              uVar7 = (ulong)((int)uVar7 + 1);
              Swap<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>>
                        (arr + uVar7,arr + uVar4);
              break;
            }
            uVar5 = uVar5 + 1;
          } while (uVar3 != uVar5);
        }
        uVar6 = (uint)uVar7;
        uVar4 = uVar4 + 1;
      } while ((uint)uVar4 != end);
    }
    if (uVar6 != start) {
      Swap<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>>(arr + uVar6,item2);
    }
    Sort<true,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>,unsigned_int>
              (arr,start,uVar6);
    start = uVar6 + 1;
  } while( true );
}

Assistant:

inline static void Sort(Type_T *arr, Number_T start, Number_T end) noexcept {
    if (start != end) {
        Type_T  &item   = arr[start];
        Number_T index  = start;
        Number_T offset = (start + Number_T{1});

        while (offset < end) {
            if (Ascend_T) {
                if (arr[offset] < item) {
                    ++index;
                    Swap(arr[index], arr[offset]);
                }
            } else {
                if (arr[offset] > item) {
                    ++index;
                    Swap(arr[index], arr[offset]);
                }
            }

            ++offset;
        }

        if (index != start) {
            Swap(arr[index], arr[start]);
        }

        Sort<Ascend_T>(arr, start, index);
        ++index;
        Sort<Ascend_T>(arr, index, end);
    }
}